

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smb.c
# Opt level: O0

CURLcode smb_send_and_recv(Curl_easy *data,void **msg)

{
  CURLcode CVar1;
  char *local_48;
  char *local_40;
  size_t nread;
  anon_union_280_3_6d7b35ba_for_proto *paStack_30;
  CURLcode result;
  smb_conn *smbc;
  connectdata *conn;
  void **msg_local;
  Curl_easy *data_local;
  
  smbc = (smb_conn *)data->conn;
  paStack_30 = &((connectdata *)smbc)->proto;
  *msg = (void *)0x0;
  conn = (connectdata *)msg;
  msg_local = (void **)data;
  if (((((connectdata *)smbc)->proto).ftpc.pp.sendbuf.bufr == (char *)0x0) &&
     ((((connectdata *)smbc)->proto).ftpc.pp.response_time != 0)) {
    if ((ulong)(data->set).upload_buffer_size <
        (ulong)(((connectdata *)smbc)->proto).ftpc.pp.response_time) {
      local_48 = (char *)(ulong)(data->set).upload_buffer_size;
    }
    else {
      local_48 = (char *)(((connectdata *)smbc)->proto).ftpc.pp.response_time;
    }
    local_40 = local_48;
    (data->req).upload_fromhere = (data->state).ulbuf;
    nread._4_4_ = Curl_fillreadbuffer(data,(size_t)local_48,(size_t *)&local_40);
    if ((nread._4_4_ != CURLE_OK) && (nread._4_4_ != CURLE_AGAIN)) {
      return nread._4_4_;
    }
    if (local_40 == (char *)0x0) {
      return CURLE_OK;
    }
    (paStack_30->ftpc).pp.response_time = (paStack_30->ftpc).pp.response_time - (long)local_40;
    (paStack_30->ftpc).pp.sendbuf.bufr = local_40;
    (paStack_30->ftpc).pp.sendbuf.leng = 0;
  }
  if ((paStack_30->ftpc).pp.sendbuf.bufr != (char *)0x0) {
    CVar1 = smb_flush((Curl_easy *)msg_local);
    if (CVar1 != CURLE_OK) {
      return CVar1;
    }
    nread._4_4_ = CURLE_OK;
  }
  if (((paStack_30->ftpc).pp.sendbuf.bufr == (char *)0x0) &&
     ((paStack_30->ftpc).pp.response_time == 0)) {
    data_local._4_4_ = smb_recv_message((Curl_easy *)msg_local,(void **)conn);
  }
  else {
    data_local._4_4_ = CURLE_AGAIN;
  }
  return data_local._4_4_;
}

Assistant:

static CURLcode smb_send_and_recv(struct Curl_easy *data, void **msg)
{
  struct connectdata *conn = data->conn;
  struct smb_conn *smbc = &conn->proto.smbc;
  CURLcode result;
  *msg = NULL; /* if it returns early */

  /* Check if there is data in the transfer buffer */
  if(!smbc->send_size && smbc->upload_size) {
    size_t nread = smbc->upload_size > (size_t)data->set.upload_buffer_size ?
      (size_t)data->set.upload_buffer_size : smbc->upload_size;
    data->req.upload_fromhere = data->state.ulbuf;
    result = Curl_fillreadbuffer(data, nread, &nread);
    if(result && result != CURLE_AGAIN)
      return result;
    if(!nread)
      return CURLE_OK;

    smbc->upload_size -= nread;
    smbc->send_size = nread;
    smbc->sent = 0;
  }

  /* Check if there is data to send */
  if(smbc->send_size) {
    result = smb_flush(data);
    if(result)
      return result;
  }

  /* Check if there is still data to be sent */
  if(smbc->send_size || smbc->upload_size)
    return CURLE_AGAIN;

  return smb_recv_message(data, msg);
}